

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::outfaces(tetgenmesh *this,tetgenio *out)

{
  uint uVar1;
  tetgenbehavior *ptVar2;
  memorypool *pmVar3;
  void **ppvVar4;
  tetrahedron ppdVar5;
  tetrahedron ppdVar6;
  tetrahedron ppdVar7;
  tetrahedron ppdVar8;
  tetrahedron ppdVar9;
  tetgenio *ptVar10;
  size_t sVar11;
  int *piVar12;
  tetrahedron *pppdVar13;
  FILE *__stream;
  undefined4 *puVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  int *piVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  point pp [3];
  char facefilename [1024];
  uint local_4b4;
  uint local_4b0;
  uint local_4ac;
  int local_498;
  int local_494;
  FILE *local_490;
  long local_488 [4];
  long local_468;
  int *local_460;
  tetgenmesh *local_458;
  ulong local_450;
  int *local_448;
  long local_440;
  char local_438 [4];
  undefined2 auStack_434 [514];
  
  local_488[0] = 0;
  local_488[1] = 0;
  local_488[2] = 0;
  if (out == (tetgenio *)0x0) {
    strcpy(local_438,this->b->outfilename);
    sVar11 = strlen(local_438);
    builtin_strncpy(local_438 + sVar11,".fac",4);
    *(undefined2 *)((long)auStack_434 + sVar11) = 0x65;
  }
  if (this->b->quiet == 0) {
    if (out == (tetgenio *)0x0) {
      printf("Writing %s.\n",local_438);
    }
    else {
      puts("Writing faces.");
    }
  }
  lVar23 = this->tetrahedrons->items - this->hullsize;
  uVar22 = (this->hullsize + lVar23 * 4) / 2;
  local_468 = lVar23;
  if (out == (tetgenio *)0x0) {
    local_490 = fopen(local_438,"w");
    if (local_490 == (FILE *)0x0) {
      printf("File I/O Error:  Cannot create file %s.\n",local_438);
      puVar14 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar14 = 1;
      __cxa_throw(puVar14,&int::typeinfo,0);
    }
    local_460 = (int *)0x0;
    fprintf(local_490,"%ld  %d\n",uVar22,(ulong)(this->b->nobound == 0));
    local_448 = (int *)0x0;
  }
  else {
    uVar24 = uVar22 * 4;
    uVar17 = 0xffffffffffffffff;
    if (uVar22 * 3 < 0x4000000000000000) {
      uVar17 = uVar22 * 0xc;
    }
    local_448 = (int *)operator_new__(uVar17);
    out->trifacelist = local_448;
    ptVar2 = this->b;
    if (ptVar2->order == 2) {
      piVar12 = (int *)operator_new__(uVar17);
      out->o2facelist = piVar12;
    }
    if (ptVar2->nobound == 0) {
      if (0x3fffffffffffffff < uVar22) {
        uVar24 = 0xffffffffffffffff;
      }
      piVar12 = (int *)operator_new__(uVar24);
      out->trifacemarkerlist = piVar12;
    }
    if (1 < ptVar2->neighout) {
      piVar12 = (int *)operator_new__(-(ulong)((uVar22 & 0x6000000000000000) != 0) | uVar22 * 8);
      out->face2tetlist = piVar12;
    }
    out->numberoftrifaces = (int)uVar22;
    local_460 = out->trifacemarkerlist;
    local_490 = (FILE *)0x0;
    lVar23 = local_468;
  }
  ptVar2 = this->b;
  uVar22 = 0;
  if (ptVar2->neighout < 2) {
    piVar12 = (int *)0x0;
  }
  else {
    uVar24 = 0xffffffffffffffff;
    if ((ulong)(lVar23 * 4) < 0x4000000000000000) {
      uVar24 = lVar23 << 4;
    }
    piVar12 = (int *)operator_new__(uVar24);
  }
  if (ptVar2->zeroindex == 0) {
    uVar22 = (ulong)(uint)this->in->firstnumber;
  }
  pmVar3 = this->tetrahedrons;
  iVar20 = this->in->firstnumber;
  ppvVar4 = pmVar3->firstblock;
  pmVar3->pathblock = ppvVar4;
  pmVar3->pathitem =
       (void *)((long)ppvVar4 +
               (((long)pmVar3->alignbytes + 8U) -
               (ulong)(ppvVar4 + 1) % (ulong)(long)pmVar3->alignbytes));
  pmVar3->pathitemsleft = pmVar3->itemsperblock;
  local_450 = uVar22;
  pppdVar13 = tetrahedrontraverse(this);
  if (pppdVar13 != (tetrahedron *)0x0) {
    uVar15 = (uint)(iVar20 == 1 && (int)uVar22 == 0);
    local_498 = 0;
    local_494 = 0;
    uVar22 = local_450 & 0xffffffff;
    local_4b4 = 0;
    local_4ac = 0;
    local_4b0 = 0;
    local_458 = this;
    do {
      lVar23 = 0;
      do {
        uVar24 = (ulong)pppdVar13[lVar23] & 0xfffffffffffffff0;
        uVar1 = fsymtbl[lVar23][(uint)pppdVar13[lVar23] & 0xf];
        lVar16 = (long)(int)uVar1;
        ppdVar5 = *(tetrahedron *)(uVar24 + 0x38);
        ppdVar6 = (tetrahedron)this->dummypoint;
        if ((ppdVar5 == ppdVar6) || (*(int *)(pppdVar13 + 10) < *(int *)(uVar24 + 0x50))) {
          iVar20 = (int)uVar22;
          ptVar2 = this->b;
          if (ptVar2->order == 2) {
            ppdVar7 = pppdVar13[0xb];
            lVar18 = 0;
            lVar19 = lVar23;
            do {
              lVar19 = (long)enexttbl[lVar19];
              local_488[lVar18] = (long)ppdVar7[ver2edge[lVar19]];
              lVar18 = lVar18 + 1;
            } while (lVar18 != 3);
          }
          if (ptVar2->nobound == 0) {
            if ((ptVar2->plc == 0) && (ptVar2->refine == 0)) {
              local_4b4 = (uint)(ppdVar5 == ppdVar6);
            }
            else {
              if (pppdVar13[9] == (tetrahedron)0x0) {
                uVar17 = 0;
              }
              else {
                uVar17 = (ulong)pppdVar13[9][lVar23] & 0xfffffffffffffff8;
              }
              if (uVar17 == 0) {
                local_4b4 = 0;
              }
              else {
                local_4b4 = *(uint *)(uVar17 + (long)this->shmarkindex * 4);
              }
            }
          }
          ppdVar7 = pppdVar13[orgpivot[lVar23]];
          ppdVar8 = pppdVar13[destpivot[lVar23]];
          ppdVar9 = pppdVar13[apexpivot[lVar23]];
          if (1 < ptVar2->neighout) {
            local_4ac = 0xffffffff;
            local_4b0 = 0xffffffff;
            if (pppdVar13[7] != ppdVar6) {
              local_4b0 = *(uint *)(pppdVar13 + 10);
            }
            if (ppdVar5 != ppdVar6) {
              local_4ac = *(uint *)(uVar24 + 0x50);
            }
            piVar12[(int)lVar23 + (*(int *)(pppdVar13 + 10) - (int)local_450) * 4] = iVar20;
            this = local_458;
            if (ppdVar5 != ppdVar6) {
              piVar12[(ulong)(uVar1 & 3) +
                      ((long)*(int *)(uVar24 + 0x50) - (long)(int)local_450) * 4] = iVar20;
            }
          }
          local_440 = lVar16;
          if (out == (tetgenio *)0x0) {
            fprintf(local_490,"%5d   %4d  %4d  %4d",uVar22,
                    (ulong)(*(int *)((long)ppdVar7 + (long)this->pointmarkindex * 4) - uVar15),
                    (ulong)(*(int *)((long)ppdVar8 + (long)this->pointmarkindex * 4) - uVar15));
            if (this->b->order == 2) {
              lVar16 = (long)this->pointmarkindex;
              fprintf(local_490,"  %4d  %4d  %4d",
                      (ulong)(*(int *)(local_488[0] + lVar16 * 4) - uVar15),
                      (ulong)(*(int *)(local_488[1] + lVar16 * 4) - uVar15),
                      (ulong)(*(int *)(local_488[2] + lVar16 * 4) - uVar15));
            }
            if (this->b->nobound == 0) {
              fprintf(local_490,"  %d",(ulong)local_4b4);
            }
            if (1 < this->b->neighout) {
              fprintf(local_490,"    %5d  %5d",(ulong)local_4b0,(ulong)local_4ac);
            }
            fputc(10,local_490);
          }
          else {
            lVar16 = (long)local_494;
            local_448[lVar16] = *(int *)((long)ppdVar7 + (long)this->pointmarkindex * 4) - uVar15;
            local_448[lVar16 + 1] =
                 *(int *)((long)ppdVar8 + (long)this->pointmarkindex * 4) - uVar15;
            local_448[lVar16 + 2] =
                 *(int *)((long)ppdVar9 + (long)this->pointmarkindex * 4) - uVar15;
            if (ptVar2->order == 2) {
              piVar21 = out->o2facelist;
              lVar16 = (long)local_498;
              piVar21[lVar16] = *(int *)(local_488[0] + (long)this->pointmarkindex * 4) - uVar15;
              piVar21[lVar16 + 1] = *(int *)(local_488[1] + (long)this->pointmarkindex * 4) - uVar15
              ;
              local_498 = local_498 + 3;
              piVar21[lVar16 + 2] = *(int *)(local_488[2] + (long)this->pointmarkindex * 4) - uVar15
              ;
            }
            if (ptVar2->nobound == 0) {
              local_460[(long)iVar20 - (long)this->in->firstnumber] = local_4b4;
            }
            local_494 = local_494 + 3;
            if (1 < ptVar2->neighout) {
              piVar21 = out->face2tetlist;
              ptVar10 = this->in;
              piVar21[((long)iVar20 - (long)ptVar10->firstnumber) * 2] = local_4b0;
              piVar21[((long)iVar20 - (long)ptVar10->firstnumber) * 2 + 1] = local_4ac;
            }
          }
          uVar22 = (ulong)(iVar20 + 1);
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 4);
      pppdVar13 = tetrahedrontraverse(this);
    } while (pppdVar13 != (tetrahedron *)0x0);
  }
  if (out == (tetgenio *)0x0) {
    fprintf(local_490,"# Generated by %s\n",this->b->commandline);
    fclose(local_490);
  }
  lVar23 = local_468;
  ptVar2 = this->b;
  if (1 < ptVar2->neighout) {
    if (out == (tetgenio *)0x0) {
      strcpy(local_438,ptVar2->outfilename);
      sVar11 = strlen(local_438);
      builtin_strncpy(local_438 + sVar11,".t2f",4);
      *(undefined1 *)((long)auStack_434 + sVar11) = 0;
    }
    if (ptVar2->quiet == 0) {
      if (out == (tetgenio *)0x0) {
        printf("Writing %s.\n",local_438);
      }
      else {
        puts("Writing tetrahedron-to-face map.");
      }
    }
    if (out == (tetgenio *)0x0) {
      __stream = fopen(local_438,"w");
      if (0 < lVar23) {
        piVar21 = piVar12 + 3;
        lVar16 = 0;
        do {
          fprintf(__stream,"%4d  %d %d %d %d\n",(ulong)(uint)(this->in->firstnumber + (int)lVar16),
                  (ulong)(uint)piVar21[-3],(ulong)(uint)piVar21[-2],(ulong)(uint)piVar21[-1],
                  *piVar21);
          lVar16 = lVar16 + 1;
          piVar21 = piVar21 + 4;
        } while (lVar23 != lVar16);
      }
      fclose(__stream);
      if (piVar12 != (int *)0x0) {
        operator_delete__(piVar12);
      }
    }
    else {
      out->tet2facelist = piVar12;
    }
  }
  return;
}

Assistant:

void tetgenmesh::outfaces(tetgenio* out)
{
  FILE *outfile = NULL;
  char facefilename[FILENAMESIZE];
  triface tface, tsymface;
  face checkmark;
  point torg, tdest, tapex;
  long ntets, faces;
  int *elist = NULL, *emlist = NULL;
  int neigh1 = 0, neigh2 = 0;
  int marker = 0;
  int firstindex, shift;
  int facenumber;
  int index = 0;

  // For -o2 option.
  triface workface;
  point *extralist, pp[3] = {0,0,0}; 
  int highorderindex = 11; 
  int o2index = 0, i;

  // For -nn option.
  int *tet2facelist = NULL;
  int tidx; 

  if (out == (tetgenio *) NULL) {
    strcpy(facefilename, b->outfilename);
    strcat(facefilename, ".face");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", facefilename);
    } else {
      printf("Writing faces.\n");
    }
  }

  ntets = tetrahedrons->items - hullsize;
  faces = (ntets * 4l + hullsize) / 2l;

  if (out == (tetgenio *) NULL) {
    outfile = fopen(facefilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", facefilename);
      terminatetetgen(this, 1);
    }
    fprintf(outfile, "%ld  %d\n", faces, !b->nobound);
  } else {
    // Allocate memory for 'trifacelist'.
    out->trifacelist = new int[faces * 3];
    if (out->trifacelist == (int *) NULL) {
      printf("Error:  Out of memory.\n");
      terminatetetgen(this, 1);
    }
    if (b->order == 2) {
      out->o2facelist = new int[faces * 3];
    }
    // Allocate memory for 'trifacemarkerlist' if necessary.
    if (!b->nobound) {
      out->trifacemarkerlist = new int[faces];
      if (out->trifacemarkerlist == (int *) NULL) {
        printf("Error:  Out of memory.\n");
        terminatetetgen(this, 1);
      }
    }
    if (b->neighout > 1) {
      // '-nn' switch.
      out->face2tetlist = new int[faces * 2];
      if (out->face2tetlist == (int *) NULL) {
        printf("Error:  Out of memory.\n");
        terminatetetgen(this, 1);
      }
    }
    out->numberoftrifaces = faces;
    elist = out->trifacelist;
    emlist = out->trifacemarkerlist;
  }

  if (b->neighout > 1) { // -nn option
    // Output the tetrahedron-to-face map.
    tet2facelist = new int[ntets * 4];
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shiftment.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift the output indices by 1.
  }

  tetrahedrons->traversalinit();
  tface.tet = tetrahedrontraverse();
  facenumber = firstindex; // in->firstnumber;
  // To loop over the set of faces, loop over all tetrahedra, and look at
  //   the four faces of each one. If its adjacent tet is a hull tet,
  //   operate on the face, otherwise, operate on the face only if the
  //   current tet has a smaller index than its neighbor.
  while (tface.tet != (tetrahedron *) NULL) {
    for (tface.ver = 0; tface.ver < 4; tface.ver ++) {
      fsym(tface, tsymface);
      if (ishulltet(tsymface) || 
          (elemindex(tface.tet) < elemindex(tsymface.tet))) {
        torg = org(tface);
        tdest = dest(tface);
        tapex = apex(tface);
        if (b->order == 2) { // -o2
          // Get the three extra vertices on edges.
          extralist = (point *) (tface.tet[highorderindex]);
          // The extra vertices are on edges opposite the corners.
          enext(tface, workface);
          for (i = 0; i < 3; i++) {
            pp[i] = extralist[ver2edge[workface.ver]];
            enextself(workface);
          }
        }
        if (!b->nobound) {
          // Get the boundary marker of this face.
          if (b->plc || b->refine) { 
            // Shell face is used.
            tspivot(tface, checkmark);
            if (checkmark.sh == NULL) {
              marker = 0;  // It is an inner face. It's marker is 0.
            } else {
              marker = shellmark(checkmark);
            }
          } else {
            // Shell face is not used, only distinguish outer and inner face.
            marker = (int) ishulltet(tsymface);
          }
        }
        if (b->neighout > 1) {
          // '-nn' switch. Output adjacent tets indices.
          if (!ishulltet(tface)) {
            neigh1 = elemindex(tface.tet);
          } else {
            neigh1 = -1;
          }
          if (!ishulltet(tsymface)) {
            neigh2 = elemindex(tsymface.tet);
          } else {
            neigh2 = -1;  
          }
		  // Fill the tetrahedron-to-face map.
		  tidx = elemindex(tface.tet) - firstindex;
		  tet2facelist[tidx * 4 + tface.ver] = facenumber;
		  if (!ishulltet(tsymface)) {
		    tidx = elemindex(tsymface.tet) - firstindex;
			tet2facelist[tidx * 4 + (tsymface.ver & 3)] = facenumber;
		  }
        }
        if (out == (tetgenio *) NULL) {
          // Face number, indices of three vertices.
          fprintf(outfile, "%5d   %4d  %4d  %4d", facenumber,
                  pointmark(torg) - shift, pointmark(tdest) - shift,
                  pointmark(tapex) - shift);
          if (b->order == 2) { // -o2
            fprintf(outfile, "  %4d  %4d  %4d", pointmark(pp[0]) - shift, 
                    pointmark(pp[1]) - shift, pointmark(pp[2]) - shift);
          }
          if (!b->nobound) {
            // Output a boundary marker.
            fprintf(outfile, "  %d", marker);
          }
          if (b->neighout > 1) {
            fprintf(outfile, "    %5d  %5d", neigh1, neigh2);
          }
          fprintf(outfile, "\n");
        } else {
          // Output indices of three vertices.
          elist[index++] = pointmark(torg) - shift;
          elist[index++] = pointmark(tdest) - shift;
          elist[index++] = pointmark(tapex) - shift;
          if (b->order == 2) { // -o2
            out->o2facelist[o2index++] = pointmark(pp[0]) - shift;
            out->o2facelist[o2index++] = pointmark(pp[1]) - shift;
            out->o2facelist[o2index++] = pointmark(pp[2]) - shift;
          }
          if (!b->nobound) {
            emlist[facenumber - in->firstnumber] = marker;
          }
          if (b->neighout > 1) {
            out->face2tetlist[(facenumber - in->firstnumber) * 2]     = neigh1;
            out->face2tetlist[(facenumber - in->firstnumber) * 2 + 1] = neigh2;
          }
        }
        facenumber++;
      }
    }
    tface.tet = tetrahedrontraverse();
  }

  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }

  if (b->neighout > 1) { // -nn option
    // Output the tetrahedron-to-face map.
	if (out == (tetgenio *) NULL) {
	  strcpy(facefilename, b->outfilename);
      strcat(facefilename, ".t2f");
    }
	if (!b->quiet) {
      if (out == (tetgenio *) NULL) {
        printf("Writing %s.\n", facefilename);
      } else {
        printf("Writing tetrahedron-to-face map.\n");
      }
    }
	if (out == (tetgenio *) NULL) {
      outfile = fopen(facefilename, "w");
      for (tidx = 0; tidx < ntets; tidx++) {
        index = tidx * 4;
        fprintf(outfile, "%4d  %d %d %d %d\n", tidx + in->firstnumber,
                tet2facelist[index], tet2facelist[index+1], 
                tet2facelist[index+2], tet2facelist[index+3]);
      }
      fclose(outfile);
      delete [] tet2facelist;
    } else {
	  // Simply copy the address of the list to the output.
      out->tet2facelist = tet2facelist;
    }
  }
}